

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall NEST::LArNEST::GetPhotonEnergy(LArNEST *this,bool state)

{
  RandomGen *pRVar1;
  bool state_local;
  LArNEST *this_local;
  
  if (state) {
    pRVar1 = RandomGen::rndm();
    this_local = (LArNEST *)RandomGen::rand_zero_trunc_gauss(pRVar1,(double)0x4023666666666666,0.2);
  }
  else {
    pRVar1 = RandomGen::rndm();
    this_local = (LArNEST *)RandomGen::rand_zero_trunc_gauss(pRVar1,9.69,0.22);
  }
  return (double)this_local;
}

Assistant:

double LArNEST::GetPhotonEnergy(bool state) {
  // liquid Argon
  // TODO: What is this function about?
  if (state) {
    return RandomGen::rndm()->rand_zero_trunc_gauss(9.7, 0.2);
  } else {
    return RandomGen::rndm()->rand_zero_trunc_gauss(9.69, 0.22);
  }
}